

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O1

void __thiscall Comment_BashTrailing_Test::TestBody(Comment_BashTrailing_Test *this)

{
  FunctionMocker<std::error_code_()> *this_00;
  TypedExpectation<std::error_code_()> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertHelper local_110;
  char *local_108;
  long local_100;
  undefined6 local_f8;
  undefined2 uStack_f2;
  undefined6 uStack_f0;
  undefined1 local_ea;
  string local_e8;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  parser<callbacks_proxy<mock_json_callbacks>_> local_b8;
  
  this_00 = &(this->super_Comment).callbacks_.super_mock_json_callbacks.gmock00_null_value_49;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,&(this->super_Comment).callbacks_);
  local_b8.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )(__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
          )this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      ((MockSpec<std::error_code_()> *)&local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x3c,"callbacks_","null_value ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(this_01,1);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&local_b8,(this->super_Comment).proxy_.original_,bash_comments);
  local_f8 = 0x23206c6c756e;
  uStack_f2 = 0x6320;
  uStack_f0 = 0x746e656d6d6f;
  local_100 = 0xe;
  local_ea = 0;
  local_108 = (char *)&local_f8;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_e8,0xe);
  local_e8._M_string_length = (size_type)&local_f8;
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)&local_b8,
                       (span<const_char,__1L> *)&local_e8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  if (local_108 != (char *)&local_f8) {
    operator_delete(local_108,CONCAT26(uStack_f2,local_f8) + 1);
  }
  local_c8[0] = (internal)(local_b8.error_._M_value == 0);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_b8.error_._M_cat + 0x20))
              (&local_108,local_b8.error_._M_cat,local_b8.error_._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_head_impl + 0x10),local_108,local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_c8,(AssertionResult *)"p.has_error ()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x40,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != (char *)&local_f8) {
      operator_delete(local_108,CONCAT26(uStack_f2,local_f8) + 1);
    }
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.string_._M_dataplus._M_p != &local_b8.string_.field_2) {
    operator_delete(local_b8.string_._M_dataplus._M_p,
                    local_b8.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8.stack_.c);
  if (local_b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )0x0) {
    operator_delete((void *)local_b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (Comment, BashTrailing) {
    EXPECT_CALL (callbacks_, null_value ()).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_, json::extensions::bash_comments);
    p.input ("null # comment"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}